

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

_Bool Field_Grown(FIELD *field,int amount)

{
  int iVar1;
  int iVar2;
  char *__ptr;
  FORM *form;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *__ptr_00;
  WINDOW_conflict *pWVar6;
  FIELD *linked_field;
  FIELD *pFVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char *__dest;
  long lVar13;
  char *__src;
  
  if ((field != (FIELD *)0x0) && ((field->status & 8) != 0)) {
    iVar4 = (int)field->rows + field->nrow;
    iVar1 = field->drows;
    iVar2 = field->dcols;
    __ptr = field->buf;
    form = field->form;
    if ((form == (FORM *)0x0) || (((form->status & 1) == 0 || (form->current != field)))) {
      bVar3 = false;
    }
    else {
      Synchronize_Buffer(form);
      bVar3 = true;
    }
    if (iVar4 == 1) {
      iVar5 = field->cols * amount;
      iVar9 = field->maxgrow;
      iVar8 = iVar9 - field->dcols;
      if (iVar5 <= iVar8) {
        iVar8 = iVar5;
      }
      if (iVar9 == 0) {
        iVar8 = iVar5;
      }
      iVar8 = iVar8 + field->dcols;
      field->dcols = iVar8;
    }
    else {
      iVar5 = ((int)field->rows + field->nrow) * amount;
      iVar9 = field->maxgrow;
      iVar8 = iVar9 - field->drows;
      if (iVar5 <= iVar8) {
        iVar8 = iVar5;
      }
      if (iVar9 == 0) {
        iVar8 = iVar5;
      }
      iVar8 = iVar8 + field->drows;
      field->drows = iVar8;
    }
    if (iVar8 == iVar9) {
      *(byte *)&field->status = (byte)field->status & 0xf7;
    }
    lVar13 = (long)field->dcols * (long)field->drows;
    iVar8 = (int)lVar13;
    uVar12 = (uint)field->nbuf;
    __ptr_00 = (char *)malloc((long)(int)((uVar12 + 1) * (iVar8 + 1)));
    if (__ptr_00 != (char *)0x0) {
      iVar9 = iVar2 * iVar1;
      field->buf = __ptr_00;
      __src = __ptr;
      for (lVar11 = 0; lVar11 <= (short)uVar12; lVar11 = lVar11 + 1) {
        __dest = field->buf + ((long)field->dcols * (long)field->drows + 1) * lVar11;
        memcpy(__dest,__src,(long)iVar9);
        if (iVar9 < iVar8) {
          memset(__dest + iVar9,0x20,(long)(iVar8 - iVar9));
        }
        __dest[lVar13] = '\0';
        uVar12 = (uint)(ushort)field->nbuf;
        __src = __src + (iVar9 + 1);
      }
      if (bVar3) {
        pWVar6 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
        if (pWVar6 == (WINDOW_conflict *)0x0) {
          field->dcols = iVar2;
          field->drows = iVar1;
          field->buf = __ptr;
          if (iVar4 == 1) {
            iVar1 = iVar2;
          }
          if (iVar1 != field->maxgrow) {
            *(byte *)&field->status = (byte)field->status | 8;
          }
          free(__ptr_00);
          return false;
        }
        if (form == (FORM *)0x0) {
          __assert_fail("form!=(FORM *)0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                        ,0x21a,"_Bool Field_Grown(FIELD *, int)");
        }
        delwin(form->w);
        form->w = pWVar6;
        wbkgdset(pWVar6,field->back | field->pad);
        wattrset(form->w,field->fore);
        werase(form->w);
        Buffer_To_Window(field,form->w);
        pWVar6 = form->w;
        if (pWVar6 == (WINDOW_conflict *)0x0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = (ulong)((int)pWVar6->_maxy + 1);
        }
        wtouchln(pWVar6,0,uVar10,0);
        wmove(form->w,form->currow,form->curcol);
      }
      free(__ptr);
      pFVar7 = field->link;
      if (pFVar7 != field) {
        for (; pFVar7 != field; pFVar7 = pFVar7->link) {
          pFVar7->buf = field->buf;
          iVar2 = field->dcols;
          pFVar7->drows = field->drows;
          pFVar7->dcols = iVar2;
        }
        return true;
      }
      return true;
    }
    field->dcols = iVar2;
    field->drows = iVar1;
    if (iVar4 == 1) {
      iVar1 = iVar2;
    }
    if (iVar1 != iVar9) {
      *(byte *)&field->status = (byte)field->status | 8;
    }
  }
  return false;
}

Assistant:

static bool Field_Grown(FIELD * field, int amount)
{
  bool result = FALSE;

  if (field && Growable(field))
    {
      bool single_line_field = Single_Line_Field(field);
      int old_buflen = Buffer_Length(field);
      int new_buflen;
      int old_dcols = field->dcols;
      int old_drows = field->drows;
      char *oldbuf  = field->buf;
      char *newbuf;

      int growth;
      FORM *form = field->form;
      bool need_visual_update = ((form != (FORM *)0)      &&
                                 (form->status & _POSTED) &&
                                 (form->current==field));
      
      if (need_visual_update)
        Synchronize_Buffer(form);
      
      if (single_line_field)
        {
          growth = field->cols * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->dcols,growth);
          field->dcols += growth;
          if (field->dcols == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      else
        {
          growth = (field->rows + field->nrow) * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->drows,growth);
          field->drows += growth;
          if (field->drows == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      /* drows, dcols changed, so we get really the new buffer length */
      new_buflen = Buffer_Length(field);
      newbuf=(char *)malloc((size_t)Total_Buffer_Size(field));
      if (!newbuf)
        { /* restore to previous state */
          field->dcols = old_dcols;
          field->drows = old_drows;
          if (( single_line_field && (field->dcols!=field->maxgrow)) ||
              (!single_line_field && (field->drows!=field->maxgrow)))
            field->status |= _MAY_GROW;
          return FALSE;
        }
      else
        { /* Copy all the buffers. This is the reason why we can't
             just use realloc().
             */
          int i;
          char *old_bp;
          char *new_bp;
          
          field->buf = newbuf;
          for(i=0;i<=field->nbuf;i++)
            {
              new_bp = Address_Of_Nth_Buffer(field,i);
              old_bp = oldbuf + i*(1+old_buflen);
              memcpy(new_bp,old_bp,(size_t)old_buflen);
              if (new_buflen > old_buflen)
                memset(new_bp + old_buflen,C_BLANK,
                       (size_t)(new_buflen - old_buflen));
              *(new_bp + new_buflen) = '\0';
            }

          if (need_visual_update)
            {         
              WINDOW *new_window = newpad(field->drows,field->dcols);
              if (!new_window)
                { /* restore old state */
                  field->dcols = old_dcols;
                  field->drows = old_drows;
                  field->buf   = oldbuf;
                  if (( single_line_field              && 
                        (field->dcols!=field->maxgrow)) ||
                      (!single_line_field              && 
                       (field->drows!=field->maxgrow)))
                    field->status |= _MAY_GROW;
                  free( newbuf );
                  return FALSE;
                }
              assert(form!=(FORM *)0);
              delwin(form->w);
              form->w = new_window;
              Set_Field_Window_Attributes(field,form->w);
              werase(form->w);
              Buffer_To_Window(field,form->w);
              untouchwin(form->w);
              wmove(form->w,form->currow,form->curcol);
            }

          free(oldbuf);
          /* reflect changes in linked fields */
          if (field != field->link)
            {
              FIELD *linked_field;
              for(linked_field = field->link;
                  linked_field!= field;
                  linked_field = linked_field->link)
                {
                  linked_field->buf   = field->buf;
                  linked_field->drows = field->drows;
                  linked_field->dcols = field->dcols;
                }
            }
          result = TRUE;
        }       
    }
  return(result);
}